

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O0

QDataStream * __thiscall QDataStream::operator>>(QDataStream *this,double *f)

{
  long lVar1;
  int iVar2;
  FloatingPointPrecision FVar3;
  qint64 qVar4;
  void *pvVar5;
  QDataStream *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  anon_union_8_2_325945a2 x;
  float d;
  QDataStream *this_00;
  QDataStream *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  iVar2 = version(in_RDI);
  if ((iVar2 < 0xc) || (FVar3 = floatingPointPrecision(in_RDI), FVar3 != SinglePrecision)) {
    in_RSI->d = (void *)0x0;
    local_20 = in_RDI;
    if (in_RDI->dev != (QIODevice *)0x0) {
      qVar4 = readBlock(this_00,(char *)in_RSI,(qint64)in_RDI);
      local_20 = in_RDI;
      if (qVar4 == 8) {
        if ((in_RDI->noswap & 1U) == 0) {
          pvVar5 = (void *)qbswap<unsigned_long_long,void>(0x485172);
          in_RSI->d = pvVar5;
          local_20 = in_RDI;
        }
      }
      else {
        in_RSI->d = (void *)0x0;
      }
    }
  }
  else {
    operator>>(in_RSI,(float *)in_RDI);
    in_RSI->d = (void *)0xfff8000000000000;
    local_20 = in_RDI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

QDataStream &QDataStream::operator>>(double &f)
{
    if (version() >= QDataStream::Qt_4_6
        && floatingPointPrecision() == QDataStream::SinglePrecision) {
        float d;
        *this >> d;
        f = d;
        return *this;
    }

    f = 0.0;
    CHECK_STREAM_PRECOND(*this)
    if (readBlock(reinterpret_cast<char *>(&f), 8) != 8) {
        f = 0.0;
    } else {
        if (!noswap) {
            union {
                double val1;
                quint64 val2;
            } x;
            x.val2 = qbswap(*reinterpret_cast<quint64 *>(&f));
            f = x.val1;
        }
    }
    return *this;
}